

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Character * __thiscall World::GetCharacter(World *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference ppCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Character *local_60;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  string *local_20;
  string *name_local;
  World *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  util::lowercase((string *)&__range1,name);
  std::__cxx11::string::operator=((string *)name,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&character);
    if (!bVar1) {
      return (Character *)0x0;
    }
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    local_60 = *ppCVar3;
    (*(local_60->super_Command_Source)._vptr_Command_Source[2])(&local_80);
    _Var2 = std::operator==(&local_80,name);
    std::__cxx11::string::~string((string *)&local_80);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  return local_60;
}

Assistant:

Character *World::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName() == name)
		{
			return character;
		}
	}

	return 0;
}